

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O1

void __thiscall
SphericalTriangleArea_RandomSampling_Test::TestBody(SphericalTriangleArea_RandomSampling_Test *this)

{
  long lVar1;
  undefined8 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  byte bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  float *__result;
  Ray *pRVar9;
  byte bVar10;
  ulong uVar11;
  long lVar12;
  char *message;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar21 [16];
  Float FVar20;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar32 [64];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 in_ZMM3 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_ZMM5 [64];
  Hammersley2DIter __begin2;
  Float error;
  AssertionResult gtest_ar;
  undefined1 local_1a8 [16];
  Tuple3<pbrt::Vector3,_float> local_180;
  Tuple3<pbrt::Point3,_float> local_170;
  aligned_storage_t<sizeof(pbrt::TriangleIntersection),_alignof(pbrt::TriangleIntersection)>
  local_160;
  byte local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  Tuple3<pbrt::Vector3,_float> local_120;
  IndexingIterator<pbrt::detail::Hammersley2DIter> local_110;
  float local_104;
  Tuple3<pbrt::Vector3,_float> local_100;
  undefined1 local_f0 [12];
  float fStack_e4;
  float fStack_e0;
  float local_dc;
  Float local_d8;
  MediumHandle local_d0;
  Tuple3<pbrt::Point3,_float> local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  long local_90;
  Tuple3<pbrt::Vector3,_float> local_88;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [56];
  
  lVar12 = 0;
  do {
    auVar17 = in_ZMM3._0_16_;
    uVar11 = ((ulong)(lVar12 * 0x7fb5d329728ea185) >> 0x1b ^ lVar12 * 0x7fb5d329728ea185) *
             -0x7e25210b43d22bb3;
    uVar11 = ((uVar11 >> 0x21 ^ uVar11) + 1) * 0x5851f42d4c957f2d + lVar12 * -0x4f5c17a566d501a4 + 1
    ;
    uVar14 = uVar11 * 0x5851f42d4c957f2d + 1 + lVar12 * 2;
    uVar7 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
    bVar10 = (byte)(uVar11 >> 0x3b);
    auVar16 = vcvtusi2ss_avx512f(in_ZMM5._0_16_,uVar7 >> bVar10 | uVar7 << 0x20 - bVar10);
    auVar16 = vminss_avx(ZEXT416((uint)(auVar16._0_4_ * 2.3283064e-10)),
                         SUB6416(ZEXT464(0x3f7fffff),0));
    uVar7 = (uint)(uVar14 >> 0x2d) ^ (uint)(uVar14 >> 0x1b);
    bVar10 = (byte)(uVar14 >> 0x3b);
    auVar22 = vfmadd132ss_fma(auVar16,SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
    auVar16 = vfnmadd213ss_fma(auVar22,auVar22,SUB6416(ZEXT464(0x3f800000),0));
    auVar16 = vmaxss_avx(auVar16,ZEXT816(0));
    if (auVar16._0_4_ < 0.0) {
      fVar33 = sqrtf(auVar16._0_4_);
    }
    else {
      auVar16 = vsqrtss_avx(auVar16,auVar16);
      fVar33 = auVar16._0_4_;
    }
    lVar1 = lVar12 * 2 + 1;
    auVar16 = vcvtusi2ss_avx512f(auVar17,uVar7 >> bVar10 | uVar7 << 0x20 - bVar10);
    auVar16 = vminss_avx(ZEXT416((uint)(auVar16._0_4_ * 2.3283064e-10)),
                         SUB6416(ZEXT464(0x3f7fffff),0));
    fVar19 = auVar16._0_4_ * 6.2831855;
    local_138._0_4_ = fVar19;
    local_90 = lVar12;
    fVar19 = cosf(fVar19);
    local_148 = ZEXT416((uint)(fVar19 * fVar33));
    fVar19 = sinf((float)local_138._0_4_);
    auVar16 = vinsertps_avx(local_148,ZEXT416((uint)(fVar19 * fVar33)),0x10);
    local_170._0_8_ = vmovlps_avx(auVar16);
    uVar11 = uVar14 * 0x5851f42d4c957f2d + lVar1;
    uVar14 = uVar11 * 0x5851f42d4c957f2d + lVar1;
    uVar15 = uVar14 * 0x5851f42d4c957f2d + lVar1;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar11;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar14;
    auVar16 = vpunpcklqdq_avx(auVar34,auVar18);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar15 * 0x5851f42d4c957f2d + lVar1;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar15;
    auVar17 = vpunpcklqdq_avx(auVar35,auVar37);
    auVar26._0_16_ = ZEXT116(0) * auVar16 + ZEXT116(1) * auVar17;
    auVar26._16_16_ = ZEXT116(1) * auVar16;
    auVar27 = vpsrlvq_avx2(auVar26,_DAT_005ca580);
    auVar3 = vpsrlvq_avx2(auVar26,_DAT_005ca560);
    auVar16 = vpmovqd_avx512vl(auVar3 ^ auVar27);
    auVar27 = vpsrlq_avx2(auVar26,0x3b);
    auVar17 = vpmovqd_avx512vl(auVar27);
    auVar16 = vprorvd_avx512vl(auVar16,auVar17);
    auVar17 = vcvtudq2ps_avx512vl(auVar16);
    auVar16._8_4_ = 0x2f800000;
    auVar16._0_8_ = 0x2f8000002f800000;
    auVar16._12_4_ = 0x2f800000;
    auVar18 = vmulps_avx512vl(auVar17,auVar16);
    auVar17._8_4_ = 0x3f7fffff;
    auVar17._0_8_ = 0x3f7fffff3f7fffff;
    auVar17._12_4_ = 0x3f7fffff;
    uVar11 = vcmpps_avx512vl(auVar18,auVar17,1);
    bVar10 = (byte)(uVar11 >> 3);
    auVar16 = vshufps_avx(auVar18,auVar18,0xff);
    local_138 = vfmadd132ss_fma(ZEXT416((uint)(bVar10 & 1) * auVar16._0_4_ +
                                        (uint)!(bool)(bVar10 & 1) * 0x3f7fffff),
                                SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
    auVar16 = vfnmadd213ss_fma(local_138,local_138,SUB6416(ZEXT464(0x3f800000),0));
    auVar16 = vmaxss_avx(auVar16,ZEXT816(0));
    local_170.z = auVar22._0_4_;
    if (auVar16._0_4_ < 0.0) {
      local_148._0_2_ = (short)uVar11;
      fVar33 = sqrtf(auVar16._0_4_);
      uVar11 = (ulong)(ushort)local_148._0_2_;
    }
    else {
      auVar16 = vsqrtss_avx(auVar16,auVar16);
      fVar33 = auVar16._0_4_;
    }
    bVar10 = (byte)(uVar11 >> 2);
    auVar16 = vshufpd_avx(auVar18,auVar18,1);
    auVar22._8_4_ = 0x3f7fffff;
    auVar22._0_8_ = 0x3f7fffff3f7fffff;
    auVar22._12_4_ = 0x3f7fffff;
    uVar11 = vcmpps_avx512vl(auVar18,auVar22,1);
    local_148._0_4_ = (int)uVar11;
    bVar5 = (byte)(uVar11 >> 1);
    fVar19 = (float)((uint)(bVar10 & 1) * (int)(auVar16._0_4_ * 6.2831855) +
                    (uint)!(bool)(bVar10 & 1) * 0x40c90fda);
    local_b8 = ZEXT416((uint)fVar19);
    fVar19 = cosf(fVar19);
    _local_a8 = ZEXT416((uint)(fVar19 * fVar33));
    fVar19 = sinf((float)local_b8._0_4_);
    auVar16 = vinsertps_avx(_local_a8,ZEXT416((uint)(fVar19 * fVar33)),0x10);
    local_180._0_8_ = vmovlps_avx(auVar16);
    local_180.z = (float)local_138._0_4_;
    auVar16 = vmovshdup_avx(auVar18);
    local_138._0_4_ = auVar18._0_4_ * 6.2831855;
    auVar22 = vfmadd132ss_fma(ZEXT416((uint)(bVar5 & 1) * auVar16._0_4_ +
                                      (uint)!(bool)(bVar5 & 1) * 0x3f7fffff),
                              SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
    auVar16 = vfnmadd213ss_fma(auVar22,auVar22,SUB6416(ZEXT464(0x3f800000),0));
    auVar16 = vmaxss_avx(auVar16,ZEXT816(0));
    if (auVar16._0_4_ < 0.0) {
      local_138 = ZEXT416((uint)local_138._0_4_);
      fVar33 = sqrtf(auVar16._0_4_);
    }
    else {
      auVar16 = vsqrtss_avx(auVar16,auVar16);
      fVar33 = auVar16._0_4_;
    }
    fVar19 = (float)((uint)(local_148[0] & 1) * local_138._0_4_ +
                    (uint)!(bool)(local_148[0] & 1) * 0x40c90fda);
    local_138 = ZEXT416((uint)fVar19);
    fVar19 = cosf(fVar19);
    local_148 = ZEXT416((uint)(fVar19 * fVar33));
    fVar19 = sinf((float)local_138._0_4_);
    auVar16 = vinsertps_avx(local_148,ZEXT416((uint)(fVar19 * fVar33)),0x10);
    local_120._0_8_ = vmovlps_avx(auVar16);
    local_1a8._0_4_ = auVar22._0_4_;
    local_120.z = (float)local_1a8._0_4_;
    local_1a8._0_4_ = (float)local_1a8._0_4_ + local_170.z + local_180.z;
    auVar38._0_4_ = local_170.x + local_180.x + auVar16._0_4_;
    auVar38._4_4_ = local_170.y + local_180.y + auVar16._4_4_;
    auVar38._8_4_ = auVar16._8_4_ + 0.0;
    auVar38._12_4_ = auVar16._12_4_ + 0.0;
    auVar21._0_4_ = auVar38._0_4_ * auVar38._0_4_;
    auVar21._4_4_ = auVar38._4_4_ * auVar38._4_4_;
    auVar21._8_4_ = auVar38._8_4_ * auVar38._8_4_;
    auVar21._12_4_ = auVar38._12_4_ * auVar38._12_4_;
    auVar16 = vmovshdup_avx(auVar21);
    auVar16 = vfmadd231ss_fma(auVar16,auVar38,auVar38);
    auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)local_1a8._0_4_),ZEXT416((uint)local_1a8._0_4_))
    ;
    if (auVar16._0_4_ < 0.0) {
      fVar33 = sqrtf(auVar16._0_4_);
    }
    else {
      auVar16 = vsqrtss_avx(auVar16,auVar16);
      fVar33 = auVar16._0_4_;
    }
    auVar36._4_4_ = fVar33;
    auVar36._0_4_ = fVar33;
    auVar36._8_4_ = fVar33;
    auVar36._12_4_ = fVar33;
    _local_a8 = vdivps_avx(auVar38,auVar36);
    local_48 = vmovshdup_avx(_local_a8);
    local_58 = ZEXT416((uint)((float)local_1a8._0_4_ / fVar33));
    auVar42._8_4_ = 0x3f800000;
    auVar42._0_8_ = 0x3f8000003f800000;
    auVar42._12_4_ = 0x3f800000;
    auVar44._8_4_ = 0x80000000;
    auVar44._0_8_ = 0x8000000080000000;
    auVar44._12_4_ = 0x80000000;
    auVar18 = vpternlogd_avx512vl(auVar42,local_58,auVar44,0xf8);
    fVar19 = auVar18._0_4_;
    fVar33 = -1.0 / ((float)local_1a8._0_4_ / fVar33 + fVar19);
    local_104 = local_a8._0_4_;
    fVar39 = local_48._0_4_;
    auVar16 = vfmadd213ss_fma(ZEXT416((uint)(local_104 * local_104 * fVar19)),ZEXT416((uint)fVar33),
                              auVar42);
    in_ZMM5 = ZEXT1664(auVar18 ^ auVar44);
    auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar39 * local_170.y)),_local_a8,
                              ZEXT416((uint)local_170.x));
    auVar22 = vfmadd231ss_fma(auVar22,local_58,ZEXT416((uint)local_170.z));
    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar39 * local_180.y)),_local_a8,
                              ZEXT416((uint)local_180.x));
    auVar17 = vfmadd231ss_fma(auVar17,local_58,ZEXT416((uint)local_180.z));
    local_f0._4_4_ = auVar17._0_4_;
    local_f0._0_4_ = auVar22._0_4_;
    auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar39 * local_120.y)),_local_a8,
                              ZEXT416((uint)local_120.x));
    auVar22 = vfmadd231ss_fma(auVar22,local_58,ZEXT416((uint)local_120.z));
    local_f0._8_4_ = auVar22._0_4_;
    lVar12 = 4;
    pRVar9 = (Ray *)local_f0;
    do {
      if (*(float *)(local_f0 + lVar12) < (pRVar9->o).super_Tuple3<pbrt::Point3,_float>.x) {
        pRVar9 = (Ray *)(local_f0 + lVar12);
      }
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0xc);
    fVar40 = fVar39 * local_104 * fVar33;
    local_148 = ZEXT416((uint)fVar40);
    local_104 = SUB164(auVar18 ^ auVar44,0) * local_104;
    auVar22 = vfmadd213ss_fma(ZEXT416((uint)(fVar39 * fVar39)),ZEXT416((uint)fVar33),auVar18);
    _local_68 = vinsertps_avx(auVar22,auVar16,0x10);
    local_b8._0_4_ = (pRVar9->o).super_Tuple3<pbrt::Point3,_float>.x;
    FVar20 = pbrt::SphericalTriangleArea
                       ((Vector3f *)&local_170,(Vector3f *)&local_180,(Vector3f *)&local_120);
    local_110.i = 0;
    local_110.n = 40000;
    _local_78 = vinsertps_avx(local_148,ZEXT416((uint)(fVar19 * fVar40)),0x10);
    iVar13 = 0;
    do {
      auVar28._0_8_ = pbrt::detail::Hammersley2DIter::operator*((Hammersley2DIter *)&local_110);
      auVar28._8_56_ = extraout_var_03;
      auVar22 = auVar28._0_16_;
      auVar16 = vmovshdup_avx(auVar22);
      fVar33 = auVar16._0_4_;
      auVar16 = SUB6416(ZEXT464(0x3f800000),0);
      if (FVar20 <= 3.1415927) {
        auVar22 = vfmadd231ss_fma(ZEXT416((uint)(1.0 - auVar28._0_4_)),auVar22,
                                  ZEXT416((uint)local_b8._0_4_));
        local_148._0_4_ = auVar22._0_4_;
        auVar16 = vfnmadd213ss_fma(auVar22,auVar22,auVar16);
        auVar16 = vmaxss_avx(auVar16,ZEXT816(0));
        if (auVar16._0_4_ < 0.0) {
          auVar31._0_4_ = sqrtf(auVar16._0_4_);
          auVar31._4_60_ = extraout_var_01;
          auVar16 = auVar31._0_16_;
        }
        else {
          auVar16 = vsqrtss_avx(auVar16,auVar16);
        }
        fVar33 = (fVar33 + fVar33) * 3.1415927;
        auVar22 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar16);
        uVar2 = vcmpss_avx512f(auVar16,SUB6416(ZEXT464(0xbf800000),0),1);
        bVar6 = (bool)((byte)uVar2 & 1);
        fVar19 = (float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar22._0_4_);
        local_138._0_4_ = cosf(fVar33);
        local_138._4_4_ = extraout_XMM0_Db_00;
        local_138._8_4_ = extraout_XMM0_Dc_00;
        local_138._12_4_ = extraout_XMM0_Dd_00;
        auVar32._0_4_ = sinf(fVar33);
        auVar32._4_60_ = extraout_var_02;
        auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_148._0_4_));
        uVar2 = vcmpss_avx512f(ZEXT416((uint)local_148._0_4_),SUB6416(ZEXT464(0xbf800000),0),1);
        bVar6 = (bool)((byte)uVar2 & 1);
        fVar33 = (float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar16._0_4_);
        auVar16 = vinsertps_avx(auVar32._0_16_,ZEXT416((uint)local_138._0_4_),0x10);
        auVar24._0_4_ = auVar16._0_4_ * fVar19;
        auVar24._4_4_ = auVar16._4_4_ * fVar19;
        auVar24._8_4_ = auVar16._8_4_ * fVar19;
        auVar24._12_4_ = auVar16._12_4_ * fVar19;
        auVar16 = vmovshdup_avx(auVar24);
        auVar43._0_4_ = auVar24._0_4_ * (float)local_68._0_4_;
        auVar43._4_4_ = auVar24._4_4_ * (float)local_68._4_4_;
        auVar43._8_4_ = auVar24._8_4_ * fStack_60;
        auVar43._12_4_ = auVar24._12_4_ * fStack_5c;
        auVar22 = vshufps_avx(auVar43,auVar43,0xe1);
        fVar19 = auVar24._0_4_ * (float)local_78._0_4_ + auVar22._0_4_;
        fVar39 = auVar24._4_4_ * (float)local_78._4_4_ + auVar22._4_4_;
        fVar40 = auVar24._8_4_ * fStack_70 + auVar22._8_4_;
        fVar41 = auVar24._12_4_ * fStack_6c + auVar22._12_4_;
        in_ZMM3 = ZEXT1664(CONCAT412(fVar41,CONCAT48(fVar40,CONCAT44(fVar39,fVar19))));
        auVar23._0_4_ = fVar33 * (float)local_a8._0_4_ + fVar19;
        auVar23._4_4_ = fVar33 * (float)local_a8._4_4_ + fVar39;
        auVar23._8_4_ = fVar33 * fStack_a0 + fVar40;
        auVar23._12_4_ = fVar33 * fStack_9c + fVar41;
        local_dc = fVar33 * (float)local_58._0_4_ +
                   (auVar16._0_4_ * local_104 - auVar24._0_4_ * (float)local_48._0_4_);
      }
      else {
        auVar22 = vfmadd231ss_fma(auVar16,auVar22,ZEXT416(0xc0000000));
        in_ZMM3 = ZEXT1664(auVar22);
        local_148._0_4_ = auVar22._0_4_;
        auVar16 = vfnmadd213ss_fma(auVar22,auVar22,auVar16);
        auVar16 = vmaxss_avx(auVar16,ZEXT816(0));
        if (auVar16._0_4_ < 0.0) {
          auVar29._0_4_ = sqrtf(auVar16._0_4_);
          auVar29._4_60_ = extraout_var;
          local_138 = auVar29._0_16_;
        }
        else {
          local_138 = vsqrtss_avx(auVar16,auVar16);
        }
        local_1a8._0_4_ = cosf(fVar33 * 6.2831855);
        local_1a8._4_4_ = extraout_XMM0_Db;
        local_1a8._8_4_ = extraout_XMM0_Dc;
        local_1a8._12_4_ = extraout_XMM0_Dd;
        auVar30._0_4_ = sinf(fVar33 * 6.2831855);
        auVar30._4_60_ = extraout_var_00;
        auVar16 = vinsertps_avx(local_1a8,auVar30._0_16_,0x10);
        auVar23._0_4_ = (float)local_138._0_4_ * auVar16._0_4_;
        auVar23._4_4_ = (float)local_138._0_4_ * auVar16._4_4_;
        auVar23._8_4_ = (float)local_138._0_4_ * auVar16._8_4_;
        auVar23._12_4_ = (float)local_138._0_4_ * auVar16._12_4_;
        local_dc = (float)local_148._0_4_;
      }
      local_f0._0_4_ = 0.0;
      local_f0._4_4_ = 0.0;
      local_f0._8_4_ = 0.0;
      uVar2 = vmovlps_avx(auVar23);
      fStack_e4 = (float)uVar2;
      fStack_e0 = (float)((ulong)uVar2 >> 0x20);
      local_d8 = 0.0;
      local_d0.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               )0;
      local_c8.x = local_170.x;
      local_c8.y = local_170.y;
      local_c8.z = local_170.z;
      local_100.x = local_180.x;
      local_100.y = local_180.y;
      local_100.z = local_180.z;
      local_88.x = local_120.x;
      local_88.y = local_120.y;
      local_88.z = local_120.z;
      pbrt::IntersectTriangle
                ((optional<pbrt::TriangleIntersection> *)&local_160.__align,(Ray *)local_f0,INFINITY
                 ,(Point3f *)&local_c8,(Point3f *)&local_100,(Point3f *)&local_88);
      uVar7 = (uint)local_150;
      if (uVar7 == 1) {
        local_150 = 0;
      }
      iVar13 = iVar13 + uVar7;
      iVar8 = local_110.i + 1;
      local_110.i = iVar8;
    } while (iVar8 != 40000);
    uVar2 = vcmpss_avx512f(ZEXT416((uint)FVar20),ZEXT416(0x40490fdb),0xe);
    bVar6 = (bool)((byte)uVar2 & 1);
    fVar33 = (float)iVar13 /
             (float)((uint)bVar6 * 0x4546f194 +
                    (uint)!bVar6 *
                    (int)((1.0 / ((1.0 - (float)local_b8._0_4_) * 6.2831855)) * 40000.0));
    auVar25._0_4_ = (fVar33 - FVar20) / FVar20;
    auVar25._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar16 = vandps_avx512vl(auVar25,auVar4);
    local_100.x = auVar16._0_4_;
    local_160.__align = (anon_struct_4_0_00000001_for___align)0x3d0f5c29;
    testing::internal::CmpHelperLT<float,float>
              ((internal *)local_f0,"error","0.035f",&local_100.x,(float *)&local_160.__align);
    lVar12 = local_90;
    if (local_f0[0] == '\0') {
      testing::Message::Message((Message *)&local_160.__align);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_160._0_8_ + 0x10),"Area ",5);
      std::ostream::_M_insert<double>((double)FVar20);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_160._0_8_ + 0x10),", estimate ",0xb);
      std::ostream::_M_insert<double>((double)fVar33);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_160._0_8_ + 0x10),", va = ",7);
      pbrt::operator<<((ostream *)(local_160._0_8_ + 0x10),(Vector3<float> *)&local_170);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_160._0_8_ + 0x10),", vb = ",7);
      pbrt::operator<<((ostream *)(local_160._0_8_ + 0x10),(Vector3<float> *)&local_180);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_160._0_8_ + 0x10),", vc = ",7);
      pbrt::operator<<((ostream *)(local_160._0_8_ + 0x10),(Vector3<float> *)&local_120);
      message = "";
      if ((undefined8 *)CONCAT44(fStack_e4,local_f0._8_4_) != (undefined8 *)0x0) {
        message = *(char **)CONCAT44(fStack_e4,local_f0._8_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                 ,0x227,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_c8,(Message *)&local_160.__align);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
      if ((long *)local_160._0_8_ != (long *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && ((long *)local_160._0_8_ != (long *)0x0)) {
          (**(code **)(*(long *)local_160._0_8_ + 8))();
        }
        local_160._0_8_ = (long *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_f0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    lVar12 = lVar12 + 1;
  } while (lVar12 != 100);
  return;
}

Assistant:

TEST(SphericalTriangleArea, RandomSampling) {
    for (int i = 0; i < 100; ++i) {
        RNG rng(i);
        Vector3f a = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Vector3f b = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Vector3f c = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});

        Vector3f axis = Normalize(a + b + c);
        Frame frame = Frame::FromZ(axis);
        Float cosTheta = std::min({Dot(a, axis), Dot(b, axis), Dot(c, axis)});

        Float area = SphericalTriangleArea(a, b, c);
        bool sampleSphere = area > Pi;
        int sqrtN = 200;
        int count = 0;
        for (Point2f u : Hammersley2D(sqrtN * sqrtN)) {
            Vector3f v;
            if (sampleSphere)
                v = SampleUniformSphere(u);
            else {
                v = SampleUniformCone(u, cosTheta);
                v = frame.FromLocal(v);
            }

            if (IntersectTriangle(Ray(Point3f(0, 0, 0), v), Infinity, Point3f(a),
                                  Point3f(b), Point3f(c)))
                ++count;
        }

        Float pdf = sampleSphere ? UniformSpherePDF() : UniformConePDF(cosTheta);
        Float estA = Float(count) / (sqrtN * sqrtN * pdf);

        Float error = std::abs((estA - area) / area);
        EXPECT_LT(error, 0.035f) << "Area " << area << ", estimate " << estA
                                 << ", va = " << a << ", vb = " << b << ", vc = " << c;
    }
}